

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

string * google::protobuf::internal::(anonymous_namespace)::LocalizeRadix_abi_cxx11_
                   (char *input,char *radix_pos)

{
  char *in_RSI;
  string *in_RDI;
  int size;
  char temp [16];
  string *result;
  undefined4 in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  LogMessage *in_stack_fffffffffffffec0;
  LogMessage *this;
  undefined8 in_stack_fffffffffffffec8;
  LogLevel level;
  LogMessage *in_stack_fffffffffffffed0;
  char *in_stack_fffffffffffffee0;
  LogMessage *in_stack_fffffffffffffee8;
  string *this_00;
  LogMessage local_f8;
  byte local_b9;
  LogMessage local_b8;
  byte local_69;
  char local_68 [60];
  int local_2c;
  char local_28 [24];
  char *local_10;
  
  level = (LogLevel)((ulong)in_stack_fffffffffffffec8 >> 0x20);
  this_00 = in_RDI;
  local_10 = in_RSI;
  local_2c = snprintf(local_28,0x10,"%.1f",0x3ff8000000000000);
  local_69 = 0;
  if (local_28[0] != '1') {
    in_stack_fffffffffffffee0 = local_68;
    LogMessage::LogMessage
              (in_stack_fffffffffffffed0,level,(char *)in_stack_fffffffffffffec0,
               in_stack_fffffffffffffebc);
    local_69 = 1;
    in_stack_fffffffffffffee8 =
         LogMessage::operator<<
                   (in_stack_fffffffffffffec0,
                    (char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    LogFinisher::operator=
              ((LogFinisher *)in_stack_fffffffffffffec0,
               (LogMessage *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  }
  if ((local_69 & 1) != 0) {
    LogMessage::~LogMessage((LogMessage *)0x444eff);
  }
  local_b9 = 0;
  if (local_28[local_2c + -1] != '5') {
    in_stack_fffffffffffffed0 = &local_b8;
    LogMessage::LogMessage
              (in_stack_fffffffffffffed0,level,(char *)in_stack_fffffffffffffec0,
               in_stack_fffffffffffffebc);
    local_b9 = 1;
    LogMessage::operator<<
              (in_stack_fffffffffffffec0,
               (char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    LogFinisher::operator=
              ((LogFinisher *)in_stack_fffffffffffffec0,
               (LogMessage *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  }
  if ((local_b9 & 1) != 0) {
    LogMessage::~LogMessage((LogMessage *)0x444f94);
  }
  if (6 < local_2c) {
    this = &local_f8;
    LogMessage::LogMessage(in_stack_fffffffffffffed0,level,(char *)this,in_stack_fffffffffffffebc);
    LogMessage::operator<<
              (this,(char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    LogFinisher::operator=
              ((LogFinisher *)this,
               (LogMessage *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    LogMessage::~LogMessage((LogMessage *)0x44500a);
  }
  std::__cxx11::string::string((string *)this_00);
  strlen(local_10);
  std::__cxx11::string::reserve((ulong)this_00);
  std::__cxx11::string::append<char_const*,void>
            (this_00,(char *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  std::__cxx11::string::append((char *)this_00,(ulong)(local_28 + 1));
  std::__cxx11::string::append((char *)this_00);
  return in_RDI;
}

Assistant:

std::string LocalizeRadix(const char *input, const char *radix_pos) {
  // Determine the locale-specific radix character by calling sprintf() to
  // print the number 1.5, then stripping off the digits.  As far as I can
  // tell, this is the only portable, thread-safe way to get the C library
  // to divuldge the locale's radix character.  No, localeconv() is NOT
  // thread-safe.
  char temp[16];
  int size = snprintf(temp, sizeof(temp), "%.1f", 1.5);
  GOOGLE_CHECK_EQ(temp[0], '1');
  GOOGLE_CHECK_EQ(temp[size - 1], '5');
  GOOGLE_CHECK_LE(size, 6);

  // Now replace the '.' in the input with it.
  std::string result;
  result.reserve(strlen(input) + size - 3);
  result.append(input, radix_pos);
  result.append(temp + 1, size - 2);
  result.append(radix_pos + 1);
  return result;
}